

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O2

void Imath_2_5::transform<float,float>
               (Box<Imath_2_5::Vec3<float>_> *box,Matrix44<float> *m,
               Box<Imath_2_5::Vec3<float>_> *result)

{
  bool bVar1;
  int i;
  long lVar2;
  float *pfVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vec3<float> points [8];
  Vec3<float> local_98;
  float fStack_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float local_64;
  float fStack_60;
  float fStack_5c;
  float fStack_58;
  float local_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float local_44;
  float local_40;
  float local_3c;
  Vec3<float> local_2c;
  
  bVar1 = Box<Imath_2_5::Vec3<float>_>::isEmpty(box);
  if (!bVar1) {
    bVar1 = Box<Imath_2_5::Vec3<float>_>::isInfinite(box);
    if (!bVar1) {
      fVar5 = m->x[0][3];
      if (((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar5 = m->x[1][3], fVar5 != 0.0)) ||
          ((NAN(fVar5) || (fVar5 = m->x[2][3], fVar5 != 0.0)))) ||
         ((NAN(fVar5) || ((fVar5 = m->x[3][3], fVar5 != 1.0 || (NAN(fVar5))))))) {
        local_98.x = (box->min).x;
        local_98.y = (box->min).y;
        local_98.z = (box->min).z;
        local_68 = (box->max).x;
        local_7c = (box->max).y;
        local_84 = (box->max).z;
        fStack_8c = local_98.x;
        local_88 = local_98.y;
        local_80 = local_98.x;
        local_78 = local_98.z;
        fStack_74 = local_98.x;
        fStack_70 = local_7c;
        fStack_6c = local_84;
        local_64 = local_98.y;
        fStack_60 = local_98.z;
        fStack_5c = local_68;
        fStack_58 = local_98.y;
        local_54 = local_84;
        fStack_50 = local_68;
        fStack_4c = local_7c;
        fStack_48 = local_98.z;
        local_44 = local_68;
        local_40 = local_7c;
        local_3c = local_84;
        for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 0xc) {
          operator*((Vec3<float> *)((long)&local_98.x + lVar2),m);
          Box<Imath_2_5::Vec3<float>_>::extendBy(result,&local_2c);
        }
      }
      else {
        pfVar3 = (float *)m;
        for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
          fVar5 = m->x[3][lVar2];
          (&(result->max).x)[lVar2] = fVar5;
          (&(result->min).x)[lVar2] = fVar5;
          fVar6 = fVar5;
          for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
            fVar8 = *(float *)((long)&(box->min).x + lVar4) * pfVar3[lVar4];
            fVar7 = pfVar3[lVar4] * *(float *)((long)&(box->max).x + lVar4);
            fVar9 = fVar8;
            if (fVar7 <= fVar8) {
              fVar9 = fVar7;
            }
            fVar5 = fVar5 + fVar9;
            if (fVar7 <= fVar8) {
              fVar7 = fVar8;
            }
            fVar6 = fVar6 + fVar7;
            (&(result->min).x)[lVar2] = fVar5;
            (&(result->max).x)[lVar2] = fVar6;
          }
          pfVar3 = pfVar3 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void
transform (const Box< Vec3<S> > &box,
           const Matrix44<T>    &m,
           Box< Vec3<S> >       &result)
{
    //
    // Transform a 3D box by a matrix, and compute a new box that
    // tightly encloses the transformed box.
    //
    // If m is an affine transform, then we use James Arvo's fast
    // method as described in "Graphics Gems", Academic Press, 1990,
    // pp. 548-550.
    //

    //
    // A transformed empty box is still empty, and a transformed infinite
    // box is still infinite
    //

    if (box.isEmpty() || box.isInfinite())
    {
	return;
    }

    //
    // If the last column of m is (0 0 0 1) then m is an affine
    // transform, and we use the fast Graphics Gems trick.
    //

    if (m[0][3] == 0 && m[1][3] == 0 && m[2][3] == 0 && m[3][3] == 1)
    {
	for (int i = 0; i < 3; i++) 
        {
	    result.min[i] = result.max[i] = (S) m[3][i];

	    for (int j = 0; j < 3; j++) 
            {
		S a, b;

		a = (S) m[j][i] * box.min[j];
		b = (S) m[j][i] * box.max[j];

		if (a < b) 
                {
		    result.min[i] += a;
		    result.max[i] += b;
		}
		else 
                {
		    result.min[i] += b;
		    result.max[i] += a;
		}
	    }
	}

	return;
    }

    //
    // M is a projection matrix.  Do things the naive way:
    // Transform the eight corners of the box, and find an
    // axis-parallel box that encloses the transformed corners.
    //

    Vec3<S> points[8];

    points[0][0] = points[1][0] = points[2][0] = points[3][0] = box.min[0];
    points[4][0] = points[5][0] = points[6][0] = points[7][0] = box.max[0];

    points[0][1] = points[1][1] = points[4][1] = points[5][1] = box.min[1];
    points[2][1] = points[3][1] = points[6][1] = points[7][1] = box.max[1];

    points[0][2] = points[2][2] = points[4][2] = points[6][2] = box.min[2];
    points[1][2] = points[3][2] = points[5][2] = points[7][2] = box.max[2];

    for (int i = 0; i < 8; i++) 
	result.extendBy (points[i] * m);
}